

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::init
          (BasicVariousTessLevelsPosAttrCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  SharedPtrStateBase *pSVar3;
  RenderTarget *pRVar4;
  long *plVar5;
  ShaderProgram *pSVar6;
  SharedPtrStateBase *pSVar7;
  TestError *this_00;
  size_type *psVar8;
  Context *code;
  char *pcVar9;
  char *pcVar10;
  deInt32 *pdVar11;
  long lVar12;
  bool bVar13;
  string tessellationControlTemplate;
  ProgramSources sources;
  string local_168;
  size_type *local_148;
  value_type local_140;
  Context *local_120;
  long local_118;
  undefined1 local_110 [16];
  ProgramSources local_100;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar4->m_width,
             (RenderTarget *)(ulong)(uint)pRVar4->m_height,0x100);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (&local_100,this,(ulong)this->m_primitiveType,(ulong)this->m_spacing,"in_tc_position");
  bVar13 = this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES;
  pcVar10 = "4";
  if (bVar13) {
    pcVar10 = "3";
  }
  paVar2 = &local_168.field_2;
  pcVar9 = "";
  if (bVar13) {
    pcVar9 = "";
  }
  local_168._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,pcVar10,pcVar9);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x1c45f37);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    local_140._M_string_length = *psVar8;
    local_140.field_2._M_allocated_capacity = plVar5[3];
    local_148 = &local_140._M_string_length;
  }
  else {
    local_140._M_string_length = *psVar8;
    local_148 = (size_type *)*plVar5;
  }
  local_140._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
  code = (Context *)(plVar5 + 2);
  if ((Context *)*plVar5 == code) {
    local_110._0_8_ = code->m_testCtx;
    local_110._8_8_ = plVar5[3];
    local_120 = (Context *)local_110;
  }
  else {
    local_110._0_8_ = code->m_testCtx;
    local_120 = (Context *)*plVar5;
  }
  local_118 = plVar5[1];
  *plVar5 = (long)code;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_148 != &local_140._M_string_length) {
    operator_delete(local_148,local_140._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_168,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_120,(char *)code);
  local_148 = (size_type *)CONCAT44(local_148._4_4_,3);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_168._M_dataplus._M_p,
             local_168._M_dataplus._M_p + local_168._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + ((ulong)local_148 & 0xffffffff),&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (pSVar6,((this->super_TestCase).m_context)->m_renderCtx,&local_100);
  pSVar7 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar7->strongRefCount;
  pSVar7->strongRefCount = 0;
  pSVar7->weakRefCount = 0;
  pSVar7->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02137b98;
  pSVar7[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar6;
  pSVar7->strongRefCount = 1;
  pSVar7->weakRefCount = 1;
  pSVar3 = (this->m_program).m_state;
  if (pSVar3 != pSVar7) {
    if (pSVar3 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar11 = &pSVar3->strongRefCount;
      *pdVar11 = *pdVar11 + -1;
      UNLOCK();
      if (*pdVar11 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar11 = &((this->m_program).m_state)->weakRefCount;
      *pdVar11 = *pdVar11 + -1;
      UNLOCK();
      if (*pdVar11 == 0) {
        pSVar3 = (this->m_program).m_state;
        if (pSVar3 != (SharedPtrStateBase *)0x0) {
          (*pSVar3->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = pSVar6;
    (this->m_program).m_state = pSVar7;
    LOCK();
    pSVar7->strongRefCount = pSVar7->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar11 = &((this->m_program).m_state)->weakRefCount;
    *pdVar11 = *pdVar11 + 1;
    UNLOCK();
  }
  pdVar11 = &pSVar7->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar7->_vptr_SharedPtrStateBase[2])(pSVar7);
  }
  LOCK();
  *pdVar11 = *pdVar11 + -1;
  UNLOCK();
  if (*pdVar11 == 0) {
    (*pSVar7->_vptr_SharedPtrStateBase[1])(pSVar7);
  }
  if (local_120 != (Context *)local_110) {
    operator_delete(local_120,(ulong)((long)(Platform **)local_110._0_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  pSVar6 = (this->m_program).m_ptr;
  if ((pSVar6->m_program).m_info.linkOk != false) {
    return (int)pSVar6;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x935);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BasicVariousTessLevelsPosAttrCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	{
		glu::ProgramSources sources = makeSources(m_primitiveType, m_spacing, "in_tc_position");
		DE_ASSERT(sources.sources[glu::SHADERTYPE_TESSELLATION_CONTROL].empty());

		std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
													 "${TESSELLATION_SHADER_REQUIRE}\n"
													"\n"
													"layout (vertices = " + string(m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "3" : "4") + ") out;\n"
													"\n"
													"in highp vec2 in_tc_position[];\n"
													"\n"
													"out highp vec2 in_te_position[];\n"
													"\n"
													"uniform mediump float u_tessLevelInner0;\n"
													"uniform mediump float u_tessLevelInner1;\n"
													"uniform mediump float u_tessLevelOuter0;\n"
													"uniform mediump float u_tessLevelOuter1;\n"
													"uniform mediump float u_tessLevelOuter2;\n"
													"uniform mediump float u_tessLevelOuter3;\n"
													"\n"
													"void main (void)\n"
													"{\n"
													"	in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
													"\n"
													"	gl_TessLevelInner[0] = u_tessLevelInner0;\n"
													"	gl_TessLevelInner[1] = u_tessLevelInner1;\n"
													"\n"
													"	gl_TessLevelOuter[0] = u_tessLevelOuter0;\n"
													"	gl_TessLevelOuter[1] = u_tessLevelOuter1;\n"
													"	gl_TessLevelOuter[2] = u_tessLevelOuter2;\n"
													"	gl_TessLevelOuter[3] = u_tessLevelOuter3;\n"
													"}\n");

		sources << glu::TessellationControlSource(specializeShader(m_context, tessellationControlTemplate.c_str()));

		m_program = SharedPtr<const ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
	}

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}